

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O0

bool __thiscall Process::Converter::error(Converter *this,string *s)

{
  ostream *poVar1;
  string *s_local;
  Converter *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1;31m");
  poVar1 = std::operator<<(poVar1,(string *)s);
  std::operator<<(poVar1,anon_var_dwarf_8fa8);
  this->_error = true;
  return false;
}

Assistant:

bool Converter::error(const std::string &s)
    {
        std::cerr << "\033[1;31m" << s << " è_é\033[0m\n";
        _error = true;
        return false;
    }